

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

ssize __thiscall Socket::recvFrom(Socket *this,byte *data,usize maxSize,uint32 *ip,uint16 *port)

{
  ssize_t sVar1;
  int *piVar2;
  socklen_t sinSize;
  sockaddr_in sin;
  socklen_t local_2c;
  sockaddr local_28;
  
  local_2c = 0x10;
  sVar1 = recvfrom(this->s,data,(long)(int)maxSize,0,&local_28,&local_2c);
  if (sVar1 == -1) {
    piVar2 = __errno_location();
    if (*piVar2 == 0xb) {
      *piVar2 = 0;
    }
  }
  else {
    *ip = (uint)local_28.sa_data._2_4_ >> 0x18 | (local_28.sa_data._2_4_ & 0xff0000) >> 8 |
          (local_28.sa_data._2_4_ & 0xff00) << 8 | local_28.sa_data._2_4_ << 0x18;
    *port = local_28.sa_data._0_2_ << 8 | (ushort)local_28.sa_data._0_2_ >> 8;
  }
  return sVar1;
}

Assistant:

ssize Socket::recvFrom(byte* data, usize maxSize, uint32& ip, uint16& port)
{
  struct sockaddr_in sin;
  socklen_t sinSize = sizeof(sin);

  ssize r = ::recvfrom(s, (char*)data, (int)maxSize, 0, (sockaddr*)&sin, &sinSize);
  if(r == SOCKET_ERROR)
  {
    if(ERRNO == EWOULDBLOCK 
#ifndef _WIN32
      || ERRNO == EAGAIN
#endif
      )
    {
      SET_ERRNO(0);
    }
    return -1;
  }
  ip = ntohl(sin.sin_addr.s_addr);
  port = ntohs(sin.sin_port);
  return r;
}